

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttp2protocolhandler.cpp
# Opt level: O0

bool __thiscall
QHttp2ProtocolHandler::sendDATA
          (QHttp2ProtocolHandler *this,QHttp2Stream *stream,QHttpNetworkReply *reply)

{
  bool bVar1;
  undefined1 unaff_retaddr;
  QNonContiguousByteDevice *in_stack_00000008;
  bool startedSending;
  QHttpNetworkRequest *request;
  QHttpNetworkReplyPrivate *replyPrivate;
  uint6 in_stack_ffffffffffffffd0;
  byte bVar2;
  
  QHttpNetworkReply::d_func((QHttpNetworkReply *)0x2d2511);
  QHttpNetworkRequest::uploadByteDevice((QHttpNetworkRequest *)0x2d2548);
  bVar1 = QHttp2Stream::sendDATA((QHttp2Stream *)request,in_stack_00000008,(bool)unaff_retaddr);
  bVar2 = 0;
  if (bVar1) {
    bVar1 = QHttp2Stream::wasReset((QHttp2Stream *)CONCAT17(bVar1,(uint7)in_stack_ffffffffffffffd0))
    ;
    bVar2 = bVar1 ^ 0xff;
  }
  return (bool)(bVar2 & 1);
}

Assistant:

bool QHttp2ProtocolHandler::sendDATA(QHttp2Stream *stream, QHttpNetworkReply *reply)
{
    Q_ASSERT(reply);
    QHttpNetworkReplyPrivate *replyPrivate = reply->d_func();
    Q_ASSERT(replyPrivate);
    QHttpNetworkRequest &request = replyPrivate->request;
    Q_ASSERT(request.uploadByteDevice());

    bool startedSending = stream->sendDATA(request.uploadByteDevice(), true);
    return startedSending && !stream->wasReset();
}